

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
::~vector(vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
          *this)

{
  vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
  *in_RDI;
  LensElementInterface *in_stack_ffffffffffffffe8;
  
  clear(in_RDI);
  pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>::
  deallocate_object<pbrt::RealisticCamera::LensElementInterface>
            (&in_RDI->alloc,in_stack_ffffffffffffffe8,0x69ef4c);
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }